

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastunpack14_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar13 [32];
  undefined1 auVar12 [32];
  
  auVar9 = *(undefined1 (*) [16])in;
  auVar8._8_8_ = *(undefined8 *)(in + 2);
  auVar8._0_8_ = *(undefined8 *)(in + 2);
  auVar11._8_4_ = 0x3fff;
  auVar11._0_8_ = 0x3fff00003fff;
  auVar11._12_4_ = 0x3fff;
  auVar12._16_4_ = 0x3fff;
  auVar12._0_16_ = auVar11;
  auVar12._20_4_ = 0x3fff;
  auVar12._24_4_ = 0x3fff;
  auVar12._28_4_ = 0x3fff;
  uVar1 = in[1];
  auVar4 = vpmovsxbd_avx(ZEXT416(0x1000007));
  auVar8 = vpsllvd_avx2(auVar8,_DAT_001961c0);
  auVar7._8_8_ = 0x300000003f00;
  auVar7._0_8_ = 0x300000003f00;
  auVar7 = vpandq_avx512vl(auVar8,auVar7);
  *out = *in & 0x3fff;
  uVar2 = in[6];
  auVar13 = vpermq_avx2(ZEXT1632(auVar9),0xd8);
  auVar8 = vpinsrd_avx(auVar11,(uVar1 & 0x3ff) << 4,1);
  uVar3 = *(ulong *)(in + 4);
  auVar13 = vpshufd_avx2(auVar13,0x50);
  auVar5 = vpsrlvd_avx2(auVar13,_DAT_00191020);
  auVar13._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar8;
  auVar13._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  auVar13 = vshufps_avx(auVar13,ZEXT1632(auVar7),0x24);
  auVar12 = vpand_avx2(auVar5,auVar12);
  auVar13 = vpor_avx2(auVar5,auVar13);
  auVar13 = vpblendd_avx2(auVar12,auVar13,0x2a);
  *(undefined1 (*) [32])(out + 1) = auVar13;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar3;
  auVar8 = vpsllvd_avx2(auVar10,_DAT_001962a0);
  auVar6._8_8_ = 0x3fc000003ffc;
  auVar6._0_8_ = 0x3fc000003ffc;
  auVar8 = vpandq_avx512vl(auVar8,auVar6);
  auVar9 = vpermi2d_avx512vl(auVar4,auVar10,auVar9);
  auVar4 = vpsrlvd_avx2(auVar9,_DAT_001941e0);
  auVar9 = vpmovzxdq_avx(auVar8);
  auVar8 = vpor_avx(auVar4,auVar9);
  auVar9 = vpand_avx(auVar4,auVar11);
  auVar9 = vpblendd_avx2(auVar8,auVar9,10);
  *(undefined1 (*) [16])(out + 9) = auVar9;
  out[0xd] = (uint)(uVar3 >> 0x36) | (uVar2 & 0xf) << 10;
  out[0xe] = uVar2 >> 4 & 0x3fff;
  out[0xf] = uVar2 >> 0x12;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack14_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;
  *out = ((*in) >> 16) % (1U << 14);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 12)) << (14 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 14);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 8)) << (14 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 14);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 4)) << (14 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 14);
  out++;
  *out = ((*in) >> 18);
  ++in;
  out++;

  return in;
}